

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_utils.cpp
# Opt level: O3

string * cornelich::make_file
                   (string *__return_storage_ptr__,string *base_path,string *cycle_string,
                   string *file_name,bool append)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  path file;
  path dir;
  path local_98;
  path local_78;
  path local_58;
  uint local_38;
  
  paVar1 = &local_98.m_pathname.field_2;
  pcVar3 = (base_path->_M_dataplus)._M_p;
  local_98.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar3,pcVar3 + base_path->_M_string_length);
  paVar2 = &local_78.m_pathname.field_2;
  pcVar3 = (cycle_string->_M_dataplus)._M_p;
  local_78.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + cycle_string->_M_string_length);
  boost::filesystem::path::operator/=(&local_98,&local_78);
  local_58.m_pathname._M_dataplus._M_p = (pointer)&local_58.m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_pathname._M_dataplus._M_p == paVar1) {
    local_58.m_pathname.field_2._8_8_ = local_98.m_pathname.field_2._8_8_;
  }
  else {
    local_58.m_pathname._M_dataplus._M_p = local_98.m_pathname._M_dataplus._M_p;
  }
  local_58.m_pathname._M_string_length = local_98.m_pathname._M_string_length;
  local_98.m_pathname._M_string_length = 0;
  local_98.m_pathname.field_2._M_local_buf[0] = '\0';
  local_98.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.m_pathname._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.m_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.m_pathname._M_dataplus._M_p);
    }
  }
  if (!append) {
    pcVar3 = (file_name->_M_dataplus)._M_p;
    local_78.m_pathname._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar3,pcVar3 + file_name->_M_string_length);
    local_98.m_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_58.m_pathname._M_dataplus._M_p,
               local_58.m_pathname._M_dataplus._M_p +
               (long)(_func_int ***)local_58.m_pathname._M_string_length);
    boost::filesystem::path::operator/=(&local_98,&local_78);
    boost::filesystem::detail::status((path *)&local_38,(error_code *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.m_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.m_pathname._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.m_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.m_pathname._M_dataplus._M_p);
    }
    if (local_38 < 2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      goto LAB_0015d996;
    }
  }
  boost::filesystem::detail::status(&local_98,(error_code *)&local_58);
  if ((int)local_98.m_pathname._M_dataplus._M_p != 3) {
    boost::filesystem::detail::create_directories(&local_58,(error_code *)0x0);
  }
  pcVar3 = (file_name->_M_dataplus)._M_p;
  local_78.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + file_name->_M_string_length);
  local_98.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_58.m_pathname._M_dataplus._M_p,
             local_58.m_pathname._M_dataplus._M_p +
             (long)(_func_int ***)local_58.m_pathname._M_string_length);
  boost::filesystem::path::operator/=(&local_98,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.m_pathname._M_dataplus._M_p);
  }
  boost::filesystem::detail::status(&local_78,(error_code *)&local_98);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((uint)local_78.m_pathname._M_dataplus._M_p < 2 && !append) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_98.m_pathname._M_dataplus._M_p,
               local_98.m_pathname._M_dataplus._M_p +
               (long)(_func_int ***)local_98.m_pathname._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.m_pathname._M_dataplus._M_p);
  }
LAB_0015d996:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_pathname._M_dataplus._M_p != &local_58.m_pathname.field_2) {
    operator_delete(local_58.m_pathname._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string make_file(const std::string & base_path,
                      const std::string & cycle_string,
                      const std::string & file_name,
                      bool append)
{
    const auto dir = fs::path(base_path) / cycle_string;
    if(!append && !fs::exists(dir / file_name))
    {
        return {};
    }

    if(!fs::is_directory(dir))
    {
        fs::create_directories(dir);
    }

    const auto file = dir / file_name;
    if(fs::exists(file))
    {
        // "File exists:" << file;
    }
    else if(append)
    {
        // "File does not exist: " << file;
    }
    else
    {
        return {};
    }
    return file.string();
}